

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeCommandListAppendMemoryCopy
          (ze_command_list_handle_t hCommandList,void *dstptr,void *srcptr,size_t size,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ze_result_t unaff_EBP;
  undefined4 in_register_0000008c;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_b4;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  uVar7 = CONCAT44(in_register_0000008c,numWaitEvents);
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeCommandListAppendMemoryCopy(hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEventsLocal)"
             ,"");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 600);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar9 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    local_b4 = unaff_EBP;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        local_b4 = (**(code **)(*plVar5 + 800))
                             (plVar5,hCommandList,dstptr,srcptr,size,hSignalEvent,uVar7,phWaitEvents
                             );
        if (local_b4 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryCopy",local_b4);
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
        local_b4 = unaff_EBP;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_b4;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeCommandListAppendMemoryCopyPrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hCommandList,dstptr,
                           srcptr,size,hSignalEvent,numWaitEvents,phWaitEvents),
       zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeCommandListAppendMemoryCopy",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hCommandList,dstptr,srcptr,size,hSignalEvent,uVar7,phWaitEvents);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 0x328))
                           (plVar5,hCommandList,dstptr,srcptr,size,hSignalEvent,uVar7,phWaitEvents,
                            zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryCopy",result);
          local_b4 = result;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar2 = uVar8 + (-(ulong)(uVar9 == 0) - uVar9);
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar10) {
      return local_b4;
    }
  }
  logAndPropagateResult("zeCommandListAppendMemoryCopy",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryCopy(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* dstptr,                                   ///< [in] pointer to destination memory to copy to
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        size_t size,                                    ///< [in] size in bytes to copy
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        context.logger->log_trace("zeCommandListAppendMemoryCopy(hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEventsLocal)");

        auto pfnAppendMemoryCopy = context.zeDdiTable.CommandList.pfnAppendMemoryCopy;

        if( nullptr == pfnAppendMemoryCopy )
            return logAndPropagateResult("zeCommandListAppendMemoryCopy", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryCopyPrologue( hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryCopy", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendMemoryCopyPrologue( hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryCopy", result);
        }

        auto driver_result = pfnAppendMemoryCopy( hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEvents );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryCopyEpilogue( hCommandList, dstptr, srcptr, size, hSignalEvent, numWaitEvents, phWaitEvents ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryCopy", result);
        }

        return logAndPropagateResult("zeCommandListAppendMemoryCopy", driver_result);
    }